

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_rsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  int iVar1;
  int iVar2;
  long lVar3;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  EVP_MD_CTX *pEStack_68;
  uchar **local_60;
  size_t *local_58;
  EVP_PKEY *local_50;
  uchar local_48 [24];
  
  local_50 = (EVP_PKEY *)*abstract;
  iVar1 = _libssh2_sha1_init(&pEStack_68);
  iVar2 = -1;
  if (iVar1 != 0) {
    local_60 = signature;
    local_58 = signature_len;
    if (0 < veccount) {
      lVar3 = 0;
      do {
        iVar1 = _libssh2_sha1_update
                          (&pEStack_68,*(void **)((long)&datavec->iov_base + lVar3),
                           *(size_t *)((long)&datavec->iov_len + lVar3));
        if (iVar1 == 0) {
          return -1;
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    iVar1 = _libssh2_sha1_final(&pEStack_68,local_48);
    if (iVar1 != 0) {
      iVar2 = _libssh2_rsa_sha1_sign(session,local_50,local_48,0x14,local_60,local_58);
      iVar2 = -(uint)(iVar2 != 0);
    }
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_rsa_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha1_signv
    return _libssh2_rsa_sha1_signv(session, signature, signature_len,
                                   veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;

    if(!libssh2_sha1_init(&ctx)) {
        return -1;
    }
    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha1_update(ctx,
                                datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha1_final(ctx, hash)) {
        return -1;
    }

    ret = _libssh2_rsa_sha1_sign(session, rsactx, hash, SHA_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}